

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::check_srv_to_leave_timeout(raft_server *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  uint uVar4;
  uint64_t uVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  long in_RDI;
  ulong last_resp_ms;
  __atomic_base<int> *in_stack_ffffffffffffff88;
  char *format;
  context *in_stack_ffffffffffffff98;
  raft_server *in_stack_ffffffffffffffc0;
  ptr<peer> *in_stack_ffffffffffffffc8;
  raft_server *in_stack_ffffffffffffffd0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3b8));
  if (bVar1) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f9f12);
    uVar5 = peer::get_resp_timer_us((peer *)0x1f9f1a);
    _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff88);
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1f9f5b);
    nuraft::context::get_params(in_stack_ffffffffffffff98);
    peVar6 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f9f72);
    uVar7 = (long)_Var2 * (long)peVar6->heart_beat_interval_;
    std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1f9f91);
    if (uVar7 < uVar5 / 1000) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1f9fcf);
        iVar3 = (*peVar8->_vptr_logger[7])();
        if (2 < iVar3) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1f9ff2);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1fa008);
          uVar4 = peer::get_id((peer *)0x1fa010);
          format = &stack0xffffffffffffffc0;
          msg_if_given_abi_cxx11_
                    (format,"server to be removed %d, response timeout %lu ms. force remove now",
                     (ulong)uVar4,uVar5 / 1000);
          (*peVar8->_vptr_logger[8])
                    (peVar8,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"check_srv_to_leave_timeout",0x33,format);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        }
      }
      remove_peer_from_peers(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      reset_srv_to_leave(in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void raft_server::check_srv_to_leave_timeout() {
    if (!srv_to_leave_) return;
    ulong last_resp_ms = srv_to_leave_->get_resp_timer_us() / 1000;
    if ( last_resp_ms >
             (ulong)raft_server::raft_limits_.leave_limit_ *
             ctx_->get_params()->heart_beat_interval_ ) {
        // Timeout: remove peer.
        p_wn("server to be removed %d, response timeout %" PRIu64 " ms. "
             "force remove now",
             srv_to_leave_->get_id(),
             last_resp_ms);
        remove_peer_from_peers(srv_to_leave_);
        reset_srv_to_leave();
    }
}